

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O2

EulerAngles * __thiscall
KDIS::DATA_TYPE::EulerAngles::operator-=(EulerAngles *this,EulerAngles *Value)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar1 = Value->m_f32Psi;
  uVar3 = Value->m_f32Theta;
  uVar2 = this->m_f32Psi;
  uVar4 = this->m_f32Theta;
  this->m_f32Psi = (KFLOAT32)((float)uVar2 - (float)uVar1);
  this->m_f32Theta = (KFLOAT32)((float)uVar4 - (float)uVar3);
  this->m_f32Phi = (KFLOAT32)((float)this->m_f32Phi - (float)Value->m_f32Phi);
  return this;
}

Assistant:

EulerAngles & EulerAngles::operator -= ( const EulerAngles & Value )
{
    m_f32Psi   -= Value.m_f32Psi;
    m_f32Theta -= Value.m_f32Theta;
    m_f32Phi   -= Value.m_f32Phi;
    return *this;
}